

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# non_recursive_quick_sort.c
# Opt level: O2

void quick_sort(int *arr,int n)

{
  int l;
  int iVar1;
  int r;
  int iVar2;
  ulong uVar4;
  int low [30];
  int high [30];
  ulong uVar3;
  
  low[0] = 0;
  high[0] = n + -1;
  uVar4 = 1;
  while (uVar3 = uVar4, iVar2 = (int)uVar3, 0 < iVar2) {
    uVar4 = (ulong)(iVar2 - 1);
    l = low[uVar4];
    r = high[uVar4];
    if (l < r) {
      iVar1 = partition(arr,l,r);
      if (iVar1 - l < r - iVar1) {
        low[uVar4] = iVar1 + 1;
        low[uVar3] = l;
        r = iVar1 + -1;
      }
      else {
        high[uVar4] = iVar1 + -1;
        low[uVar3] = iVar1 + 1;
      }
      high[uVar3] = r;
      uVar4 = (ulong)(iVar2 + 1);
    }
  }
  return;
}

Assistant:

void quick_sort(int arr[], int n) {
  int sp = 1;
  int low[30], high[30];

  low[0] = 0;
  high[0] = n - 1;

  while (sp > 0) {
    sp--;
    int l = low[sp];
    int r = high[sp];

    if (l >= r)
      ;
    else {
      int v = partition(arr, l, r);
      if (v - l < r - v) {
        low[sp] = v + 1;
        high[sp] = r;
        sp++;
        low[sp] = l;
        high[sp] = v - 1;
        sp++;
      } else {
        low[sp] = l;
        high[sp] = v - 1;
        sp++;
        low[sp] = v + 1;
        high[sp] = r;
        sp++;
      }
    }
  }
}